

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

void __thiscall cmCTest::~cmCTest(cmCTest *this)

{
  PartInfo *local_20;
  cmCTest *this_local;
  
  cmDeleteAll<std::map<std::__cxx11::string,cmCTestGenericHandler*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCTestGenericHandler*>>>>
            (&this->TestingHandlers);
  SetOutputLogFileName(this,(char *)0x0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->Definitions);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->InitialCommandLineArguments);
  std::__cxx11::string::~string((string *)&this->NotesFiles);
  std::__cxx11::string::~string((string *)&this->BinaryDir);
  std::__cxx11::string::~string((string *)&this->SpecificTrack);
  std::__cxx11::string::~string((string *)&this->CurrentTag);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
  ::~map(&this->PartMap);
  local_20 = (PartInfo *)&this->PartMap;
  do {
    local_20 = local_20 + -1;
    PartInfo::~PartInfo(local_20);
  } while (local_20 != this->Parts);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->CTestConfigurationOverwrites);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->CTestConfiguration);
  std::__cxx11::string::~string((string *)&this->CTestConfigFile);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
  ::~map(&this->TestingHandlers);
  std::__cxx11::string::~string((string *)&this->StopTime);
  std::__cxx11::string::~string((string *)&this->ScheduleType);
  std::__cxx11::string::~string((string *)&this->ConfigType);
  return;
}

Assistant:

cmCTest::~cmCTest()
{
  cmDeleteAll(this->TestingHandlers);
  this->SetOutputLogFileName(CM_NULLPTR);
}